

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ProcessHorizontals(Clipper *this)

{
  TEdge *e;
  
  while (e = this->m_SortedEdges, e != (TEdge *)0x0) {
    DeleteFromSEL(this,e);
    ProcessHorizontal(this,e);
  }
  return;
}

Assistant:

void Clipper::ProcessHorizontals()
{
  TEdge* horzEdge = m_SortedEdges;
  while( horzEdge )
  {
    DeleteFromSEL( horzEdge );
    ProcessHorizontal( horzEdge );
    horzEdge = m_SortedEdges;
  }
}